

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_to_revision.cpp
# Opt level: O1

maybe<unsigned_int,_void> *
pstore::str_to_revision(maybe<unsigned_int,_void> *__return_storage_ptr__,string *str)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  string arg;
  char *endptr;
  char *local_58;
  undefined8 local_50;
  char local_48;
  undefined7 uStack_47;
  char *local_38;
  
  pbVar6 = (byte *)(str->_M_dataplus)._M_p;
  pbVar4 = pbVar6 + str->_M_string_length;
  lVar7 = (long)str->_M_string_length >> 2;
  pbVar5 = pbVar4;
  if (0 < lVar7) {
    pbVar5 = pbVar4 + lVar7 * -4;
    lVar7 = lVar7 + 1;
    do {
      iVar2 = isspace((uint)pbVar4[-1]);
      if (iVar2 == 0) goto LAB_001187b6;
      iVar2 = isspace((uint)pbVar4[-2]);
      if (iVar2 == 0) {
        pbVar4 = pbVar4 + -1;
        goto LAB_001187b6;
      }
      iVar2 = isspace((uint)pbVar4[-3]);
      if (iVar2 == 0) {
        pbVar4 = pbVar4 + -2;
        goto LAB_001187b6;
      }
      iVar2 = isspace((uint)pbVar4[-4]);
      if (iVar2 == 0) {
        pbVar4 = pbVar4 + -3;
        goto LAB_001187b6;
      }
      pbVar4 = pbVar4 + -4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  lVar7 = (long)pbVar5 - (long)pbVar6;
  if (lVar7 == 1) {
LAB_00118791:
    iVar2 = isspace((uint)pbVar5[-1]);
    pbVar4 = pbVar5;
    if (iVar2 != 0) {
      pbVar4 = pbVar6;
    }
  }
  else if (lVar7 == 2) {
LAB_0011877f:
    iVar2 = isspace((uint)pbVar5[-1]);
    pbVar4 = pbVar5;
    if (iVar2 != 0) {
      pbVar5 = pbVar5 + -1;
      goto LAB_00118791;
    }
  }
  else {
    pbVar4 = pbVar6;
    if ((lVar7 == 3) && (iVar2 = isspace((uint)pbVar5[-1]), pbVar4 = pbVar5, iVar2 != 0)) {
      pbVar5 = pbVar5 + -1;
      goto LAB_0011877f;
    }
  }
LAB_001187b6:
  lVar7 = (long)pbVar4 - (long)pbVar6 >> 2;
  pbVar5 = pbVar6;
  if (0 < lVar7) {
    pbVar5 = pbVar6 + ((long)pbVar4 - (long)pbVar6 & 0xfffffffffffffffc);
    lVar7 = lVar7 + 1;
    pbVar6 = pbVar6 + 3;
    do {
      iVar2 = isspace((uint)pbVar6[-3]);
      if (iVar2 == 0) {
        pbVar6 = pbVar6 + -3;
        goto LAB_0011888a;
      }
      iVar2 = isspace((uint)pbVar6[-2]);
      if (iVar2 == 0) {
        pbVar6 = pbVar6 + -2;
        goto LAB_0011888a;
      }
      iVar2 = isspace((uint)pbVar6[-1]);
      if (iVar2 == 0) {
        pbVar6 = pbVar6 + -1;
        goto LAB_0011888a;
      }
      iVar2 = isspace((uint)*pbVar6);
      if (iVar2 == 0) goto LAB_0011888a;
      lVar7 = lVar7 + -1;
      pbVar6 = pbVar6 + 4;
    } while (1 < lVar7);
  }
  lVar7 = (long)pbVar4 - (long)pbVar5;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      pbVar6 = pbVar4;
      if ((lVar7 != 3) || (iVar2 = isspace((uint)*pbVar5), pbVar6 = pbVar5, iVar2 == 0))
      goto LAB_0011888a;
      pbVar5 = pbVar5 + 1;
    }
    iVar2 = isspace((uint)*pbVar5);
    pbVar6 = pbVar5;
    if (iVar2 == 0) goto LAB_0011888a;
    pbVar5 = pbVar5 + 1;
  }
  iVar2 = isspace((uint)*pbVar5);
  pbVar6 = pbVar5;
  if (iVar2 != 0) {
    pbVar6 = pbVar4;
  }
LAB_0011888a:
  local_50 = 0;
  local_48 = '\0';
  local_58 = &local_48;
  unsigned_cast<long,unsigned_long,void>((long)pbVar4 - (long)pbVar6);
  std::__cxx11::string::reserve((ulong)&local_58);
  for (; pbVar6 != pbVar4; pbVar6 = pbVar6 + 1) {
    tolower((int)(char)*pbVar6);
    std::__cxx11::string::push_back((char)&local_58);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_58);
  pcVar1 = local_58;
  if (iVar2 == 0) {
    __return_storage_ptr__->valid_ = true;
    __return_storage_ptr__->storage_ = (type)0xffffffff;
  }
  else {
    local_38 = (char *)0x0;
    uVar3 = strtol(local_58,&local_38,10);
    if ((local_38 == pcVar1) || (0xfffffffe < uVar3 || *local_38 != '\0')) {
      __return_storage_ptr__->valid_ = false;
      *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
      __return_storage_ptr__->storage_ = (type)0x0;
      __return_storage_ptr__->valid_ = false;
    }
    else {
      __return_storage_ptr__->valid_ = true;
      __return_storage_ptr__->storage_ = SUB84(uVar3,0);
    }
  }
  if (local_58 != &local_48) {
    operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

maybe<unsigned> str_to_revision (std::string const & str) {
        std::string const arg = trim_and_lowercase (str);
        if (arg == "head") {
            return just (head_revision);
        }

        gsl::czstring const cstr = arg.c_str ();
        char * endptr = nullptr;
        long const revision = std::strtol (cstr, &endptr, 10);

        // strtol() returns LONG_MAX or LONG_MIN to indicate an overflow. endptr must point to
        // the terminating null character to ensure that the entire string was consumed. We also
        // check that revision lies within the range of numbers that we can safely represent.
        if (endptr != cstr && *endptr == '\0' && revision != LONG_MAX && revision != LONG_MIN &&
            revision >= 0 && revision != head_revision &&
            static_cast<unsigned long> (revision) < std::numeric_limits<unsigned>::max ()) {

            return just (static_cast<unsigned> (revision));
        }

        return nothing<unsigned> ();
    }